

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::acquire
          (Fasttrack<std::shared_mutex> *this,tls_t tls,void *mutex,int recursive,bool write)

{
  void *this_00;
  bool bVar1;
  pointer prVar2;
  iterator iVar3;
  ThreadState *thr;
  iterator local_60 [2];
  undefined1 local_40 [8];
  iterator it;
  lock_guard<std::shared_mutex> exLockT;
  bool write_local;
  void *pvStack_20;
  int recursive_local;
  void *mutex_local;
  tls_t tls_local;
  Fasttrack<std::shared_mutex> *this_local;
  
  if (recursive < 2) {
    pvStack_20 = mutex;
    mutex_local = tls;
    tls_local = this;
    std::lock_guard<std::shared_mutex>::lock_guard
              ((lock_guard<std::shared_mutex> *)&it.field_1,&this->g_lock);
    iVar3 = phmap::container_internal::
            raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
            ::find<void*>((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
                           *)&this->locks,&stack0xffffffffffffffe0);
    it.ctrl_ = (ctrl_t *)iVar3.field_1;
    local_40 = (undefined1  [8])iVar3.ctrl_;
    local_60[0] = phmap::container_internal::
                  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                  ::end((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                         *)&this->locks);
    bVar1 = phmap::container_internal::operator==((iterator *)local_40,local_60);
    iVar3.field_1.slot_ = (slot_type *)it.ctrl_;
    iVar3.ctrl_ = (ctrl_t *)local_40;
    if (bVar1) {
      iVar3 = createLock(this,pvStack_20);
    }
    this_00 = mutex_local;
    it.ctrl_ = (ctrl_t *)iVar3.field_1;
    local_40 = (undefined1  [8])iVar3.ctrl_;
    prVar2 = phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
             ::iterator::operator->((iterator *)local_40);
    VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
              ((VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *)
               this_00,&prVar2->second);
    std::lock_guard<std::shared_mutex>::~lock_guard((lock_guard<std::shared_mutex> *)&it.field_1);
  }
  return;
}

Assistant:

void acquire(tls_t tls, void* mutex, int recursive, bool write) final {
    if (recursive >
        1) {   // lock haven't been updated by another thread (by definition)
      return;  // therefore no action needed here as only the invoking thread
               // may have updated the lock
    }

    std::lock_guard<LockT> exLockT(g_lock);
    auto it = locks.find(mutex);
    if (it == locks.end()) {
      it = createLock(mutex);
    }
    ThreadState* thr = reinterpret_cast<ThreadState*>(tls);
    (thr)->update(it->second);
  }